

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<_24>,_Detail::M3<30>,_Detail::M3<_10>,_Detail::M2<_26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>,_2483442811U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *p;
  uint state [1391];
  uint *local_15e0;
  uint local_15d8 [1394];
  
  lVar2 = 0;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5 = (auVar4 | _DAT_0010a030) ^ _DAT_0010a040;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7ffffa91) {
      local_15d8[lVar2] = 1;
      local_15d8[lVar2 + 1] = 1;
    }
    auVar4 = (auVar4 | _DAT_0010a020) ^ _DAT_0010a040;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7ffffa91) {
      local_15d8[lVar2 + 2] = 1;
      local_15d8[lVar2 + 3] = 1;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x570);
  local_15e0 = local_15d8;
  Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<-24>,Detail::M3<30>,Detail::M3<-10>,Detail::M2<-26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,1391ul,15ul,23ul,481ul,229ul,Detail::M3<_24>,Detail::M3<30>,Detail::M3<_10>,Detail::M2<_26>,Detail::M1,Detail::M3<20>,Detail::M6<32ul,9u,3072982252u,4227858431u,131072u>,Detail::M1,Detail::MatsumotoKuritaTempering<2480739328u,4195450880u>>
              *)this,&local_15e0,local_15d8 + 0x56f);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_1391UL,_15UL,_23UL,_481UL,_229UL,_Detail::M3<-24>,_Detail::M3<30>,_Detail::M3<-10>,_Detail::M2<-26>,_Detail::M1,_Detail::M3<20>,_Detail::M6<32UL,_9U,_3072982252U,_4227858431U,_131072U>,_Detail::M1,_Detail::MatsumotoKuritaTempering<2480739328U,_4195450880U>_>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }